

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

stbi_uc * stbi_load_from_memory(stbi_uc *buffer,int len,int *x,int *y,int *comp,int req_comp)

{
  long lVar1;
  stbi_uc *psVar2;
  stbi_uc *psVar3;
  ulong uVar4;
  uint uVar5;
  long *in_FS_OFFSET;
  stbi__context s;
  int in_stack_fffffffffffffe78;
  stbi__result_info local_11c;
  stbi__context local_110;
  
  local_110.io.read = (_func_int_void_ptr_char_ptr_int *)0x0;
  local_110.read_from_callbacks = 0;
  local_110.callback_already_read = 0;
  local_110.img_buffer_end = buffer + len;
  local_110.img_buffer = buffer;
  local_110.img_buffer_original = buffer;
  local_110.img_buffer_original_end = local_110.img_buffer_end;
  psVar2 = (stbi_uc *)
           stbi__load_main(&local_110,x,y,comp,req_comp,&local_11c,in_stack_fffffffffffffe78);
  psVar3 = (stbi_uc *)0x0;
  if ((psVar2 != (stbi_uc *)0x0) && (psVar3 = psVar2, local_11c.bits_per_channel != 8)) {
    if (req_comp == 0) {
      req_comp = *comp;
    }
    uVar5 = *y * *x * req_comp;
    lVar1 = *in_FS_OFFSET;
    psVar3 = (stbi_uc *)(*(code *)in_FS_OFFSET[-0x85])(lVar1 + -0x430,1);
    if (psVar3 == (stbi_uc *)0x0) {
      in_FS_OFFSET[-0x81] = (long)"outofmem";
    }
    else {
      if (0 < (int)uVar5) {
        uVar4 = 0;
        do {
          psVar3[uVar4] = psVar2[uVar4 * 2 + 1];
          uVar4 = uVar4 + 1;
        } while (uVar5 != uVar4);
      }
      (*(code *)in_FS_OFFSET[-0x85])(lVar1 + -0x430,3);
    }
  }
  return psVar3;
}

Assistant:

STBIDEF stbi_uc *stbi_load_from_memory(stbi_uc const *buffer, int len, int *x, int *y, int *comp, int req_comp)
{
   stbi__context s;
   stbi__start_mem(&s,buffer,len);
   return stbi__load_and_postprocess_8bit(&s,x,y,comp,req_comp);
}